

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

FeatureOptions<wasm::SIMDExtractOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
          (FeatureOptions<wasm::SIMDExtractOp> *this,FeatureSet feature,SIMDExtractOp option)

{
  iterator __position;
  vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>> *this_00;
  key_type local_20;
  SIMDExtractOp local_1c;
  FeatureSet feature_local;
  SIMDExtractOp option_local;
  
  local_20.features = feature.features;
  local_1c = option;
  this_00 = (vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>> *)
            std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
            ::operator[](&this->options,&local_20);
  __position._M_current = *(SIMDExtractOp **)(this_00 + 8);
  if (__position._M_current == *(SIMDExtractOp **)(this_00 + 0x10)) {
    std::vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>>::
    _M_realloc_insert<wasm::SIMDExtractOp_const&>(this_00,__position,&local_1c);
  }
  else {
    *__position._M_current = option;
    *(SIMDExtractOp **)(this_00 + 8) = __position._M_current + 1;
  }
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }